

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O0

void __thiscall TTD::InflateMap::InflateMap(InflateMap *this)

{
  InflateMap *this_local;
  
  TTDIdentifierDictionary<unsigned_long,_Js::DynamicTypeHandler_*>::TTDIdentifierDictionary
            (&this->m_handlerMap);
  TTDIdentifierDictionary<unsigned_long,_Js::Type_*>::TTDIdentifierDictionary(&this->m_typeMap);
  TTDIdentifierDictionary<unsigned_long,_Js::GlobalObject_*>::TTDIdentifierDictionary
            (&this->m_tagToGlobalObjectMap);
  TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*>::TTDIdentifierDictionary
            (&this->m_objectMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::TTDIdentifierDictionary
            (&this->m_functionBodyMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FrameDisplay_*>::TTDIdentifierDictionary
            (&this->m_environmentMap);
  TTDIdentifierDictionary<unsigned_long,_Memory::WriteBarrierPtr<void>_*>::TTDIdentifierDictionary
            (&this->m_slotArrayMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::TTDIdentifierDictionary
            (&this->m_debuggerScopeHomeBodyMap);
  TTDIdentifierDictionary<unsigned_long,_int>::TTDIdentifierDictionary
            (&this->m_debuggerScopeChainIndexMap);
  JsUtil::
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_promiseDataMap,&Memory::HeapAllocator::Instance,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_inflatePinSet);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FrameDisplay_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_environmentPinSet);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_slotArrayPinSet);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_oldInflatePinSet);
  TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*>::TTDIdentifierDictionary
            (&this->m_oldObjectMap);
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::TTDIdentifierDictionary
            (&this->m_oldFunctionBodyMap);
  JsUtil::
  BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->m_propertyReset,&Memory::HeapAllocator::Instance,0);
  return;
}

Assistant:

InflateMap::InflateMap()
        : m_typeMap(), m_handlerMap(),
        m_tagToGlobalObjectMap(), m_objectMap(),
        m_functionBodyMap(), m_environmentMap(), m_slotArrayMap(), m_promiseDataMap(&HeapAllocator::Instance),
        m_debuggerScopeHomeBodyMap(), m_debuggerScopeChainIndexMap(),
        m_inflatePinSet(), m_environmentPinSet(), m_oldInflatePinSet(),
        m_oldObjectMap(), m_oldFunctionBodyMap(), m_propertyReset(&HeapAllocator::Instance)
    {
        ;
    }